

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O2

void sys_register_loader(loader_t loader)

{
  loader_queue_t *plVar1;
  loader_queue_t *plVar2;
  loader_queue *plVar3;
  
  plVar1 = &loaders;
  do {
    plVar2 = plVar1;
    if (plVar2->loader == loader) {
      return;
    }
    plVar1 = plVar2->next;
  } while (plVar2->next != (loader_queue *)0x0);
  plVar3 = (loader_queue *)getbytes(0x10);
  plVar2->next = plVar3;
  plVar3->loader = loader;
  plVar3->next = (loader_queue *)0x0;
  return;
}

Assistant:

void sys_register_loader(loader_t loader)
{
    loader_queue_t *q = &loaders;
    while (1)
    {
        if (q->loader == loader)    /* already loaded - nothing to do */
            return;
        else if (q->next)
            q = q->next;
        else
        {
            q->next = (loader_queue_t *)getbytes(sizeof(loader_queue_t));
            q->next->loader = loader;
            q->next->next = NULL;
            break;
        }
    }
}